

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::store_flattened_struct
          (CompilerGLSL *this,string *basename,uint32_t rhs_id,SPIRType *type,
          SmallVector<unsigned_int,_8UL> *indices)

{
  undefined8 this_00;
  uint32_t uVar1;
  uint *puVar2;
  TypedID *pTVar3;
  size_t sVar4;
  SPIRType *pSVar5;
  undefined1 local_148 [32];
  undefined1 local_128 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rhs;
  undefined1 local_e8 [40];
  string lhs;
  uint local_a8;
  uint32_t i;
  uint *index;
  uint *__end1;
  uint *__begin1;
  SmallVector<unsigned_int,_8UL> *__range1;
  SPIRType *member_type;
  undefined1 local_68 [8];
  SmallVector<unsigned_int,_8UL> sub_indices;
  SmallVector<unsigned_int,_8UL> *indices_local;
  SPIRType *type_local;
  uint32_t rhs_id_local;
  string *basename_local;
  CompilerGLSL *this_local;
  
  sub_indices.stack_storage.aligned_char._24_8_ = indices;
  SmallVector<unsigned_int,_8UL>::SmallVector((SmallVector<unsigned_int,_8UL> *)local_68,indices);
  member_type._4_4_ = 0;
  SmallVector<unsigned_int,_8UL>::push_back
            ((SmallVector<unsigned_int,_8UL> *)local_68,(uint *)((long)&member_type + 4));
  this_00 = sub_indices.stack_storage.aligned_char._24_8_;
  __end1 = VectorView<unsigned_int>::begin
                     ((VectorView<unsigned_int> *)sub_indices.stack_storage.aligned_char._24_8_);
  puVar2 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)this_00);
  __range1 = (SmallVector<unsigned_int,_8UL> *)type;
  for (; __end1 != puVar2; __end1 = __end1 + 1) {
    pTVar3 = (TypedID *)
             VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                        &__range1[2].stack_storage,(ulong)*__end1);
    uVar1 = TypedID::operator_cast_to_unsigned_int(pTVar3);
    __range1 = (SmallVector<unsigned_int,_8UL> *)
               Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar1);
  }
  local_a8 = 0;
  while( true ) {
    sVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                       &__range1[2].stack_storage);
    if ((uint)sVar4 <= local_a8) break;
    puVar2 = VectorView<unsigned_int>::back((VectorView<unsigned_int> *)local_68);
    *puVar2 = local_a8;
    to_member_name_abi_cxx11_((CompilerGLSL *)local_e8,(SPIRType *)this,(uint32_t)__range1);
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
              ((spirv_cross *)(local_e8 + 0x20),basename,(char (*) [2])0x4e3b4c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
    ::std::__cxx11::string::~string((string *)local_e8);
    ParsedIR::sanitize_underscores((string *)(local_e8 + 0x20));
    pTVar3 = (TypedID *)
             VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                        &__range1[2].stack_storage,(ulong)local_a8);
    uVar1 = TypedID::operator_cast_to_unsigned_int(pTVar3);
    pSVar5 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar1);
    if (*(int *)&(pSVar5->super_IVariant).field_0xc == 0xf) {
      store_flattened_struct
                (this,(string *)(local_e8 + 0x20),rhs_id,type,
                 (SmallVector<unsigned_int,_8UL> *)local_68);
    }
    else {
      to_expression_abi_cxx11_((CompilerGLSL *)local_128,(uint32_t)this,SUB41(rhs_id,0));
      to_multi_member_reference_abi_cxx11_
                ((CompilerGLSL *)local_148,(SPIRType *)this,(SmallVector<unsigned_int,_8UL> *)type);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_128 + 0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128);
      ::std::__cxx11::string::~string((string *)local_148);
      ::std::__cxx11::string::~string((string *)local_128);
      statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_e8 + 0x20),(char (*) [4])0x4f38c2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_128 + 0x20),(char (*) [2])0x4d9ce2);
      ::std::__cxx11::string::~string((string *)(local_128 + 0x20));
    }
    ::std::__cxx11::string::~string((string *)(local_e8 + 0x20));
    local_a8 = local_a8 + 1;
  }
  SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_68);
  return;
}

Assistant:

void CompilerGLSL::store_flattened_struct(const string &basename, uint32_t rhs_id, const SPIRType &type,
                                          const SmallVector<uint32_t> &indices)
{
	SmallVector<uint32_t> sub_indices = indices;
	sub_indices.push_back(0);

	auto *member_type = &type;
	for (auto &index : indices)
		member_type = &get<SPIRType>(member_type->member_types[index]);

	for (uint32_t i = 0; i < uint32_t(member_type->member_types.size()); i++)
	{
		sub_indices.back() = i;
		auto lhs = join(basename, "_", to_member_name(*member_type, i));
		ParsedIR::sanitize_underscores(lhs);

		if (get<SPIRType>(member_type->member_types[i]).basetype == SPIRType::Struct)
		{
			store_flattened_struct(lhs, rhs_id, type, sub_indices);
		}
		else
		{
			auto rhs = to_expression(rhs_id) + to_multi_member_reference(type, sub_indices);
			statement(lhs, " = ", rhs, ";");
		}
	}
}